

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.cpp
# Opt level: O0

MPP_RET mpp_sthd_create(MppSThdImpl *thd)

{
  int iVar1;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  undefined8 uVar2;
  MPP_RET local_4c;
  undefined1 local_48 [4];
  MPP_RET ret;
  pthread_attr_t attr;
  MppSThdImpl *thd_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  local_4c = MPP_NOK;
  attr._48_8_ = thd;
  if ((MppSThdImpl *)(thd->ctx).thd != thd) {
    uVar2 = CONCAT44(uVar3,0xee);
    _mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,"thd->ctx.thd == thd",
               "mpp_sthd_create",uVar2);
    uVar3 = (undefined4)((ulong)uVar2 >> 0x20);
    if ((mpp_debug & 0x10000000) != 0) {
      abort();
    }
  }
  if ((1 < *(int *)(attr._48_8_ + 0x10)) &&
     (_mpp_log_l(2,"mpp_thread","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "thd->status < MPP_STHD_RUNNING","mpp_sthd_create",CONCAT44(uVar3,0xef)),
     (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  pthread_attr_init((pthread_attr_t *)local_48);
  pthread_attr_setdetachstate((pthread_attr_t *)local_48,0);
  *(undefined4 *)(attr._48_8_ + 0x10) = 2;
  iVar1 = pthread_create((pthread_t *)(attr._48_8_ + 0x18),(pthread_attr_t *)local_48,
                         *(__start_routine **)(attr._48_8_ + 8),(void *)(attr._48_8_ + 0x78));
  if (iVar1 == 0) {
    iVar1 = pthread_setname_np(*(pthread_t *)(attr._48_8_ + 0x18),*(char **)attr._48_8_);
    if (iVar1 != 0) {
      _mpp_log_l(2,"mpp_thread","%s %p setname failed\n",(char *)0x0,
                 *(undefined8 *)(attr._48_8_ + 0x18),*(undefined8 *)(attr._48_8_ + 8));
    }
    if ((thread_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_thread","thread %s %p context %p create success\n",(char *)0x0,
                 *(undefined8 *)attr._48_8_,*(undefined8 *)(attr._48_8_ + 8),
                 *(undefined8 *)(attr._48_8_ + 0x80));
    }
    local_4c = MPP_OK;
  }
  else {
    *(undefined4 *)(attr._48_8_ + 0x10) = 1;
  }
  pthread_attr_destroy((pthread_attr_t *)local_48);
  return local_4c;
}

Assistant:

static MPP_RET mpp_sthd_create(MppSThdImpl *thd)
{
    pthread_attr_t attr;
    MPP_RET ret = MPP_NOK;

    mpp_assert(thd->ctx.thd == thd);
    mpp_assert(thd->status < MPP_STHD_RUNNING);

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    // NOTE: set status to running first
    thd->status = MPP_STHD_RUNNING;
    if (0 == pthread_create(&thd->thd, &attr, (MppThreadFunc)thd->func, &thd->ctx)) {
        ret = (MPP_RET)pthread_setname_np(thd->thd, thd->name);
        if (ret)
            mpp_err("%s %p setname failed\n", thd->thd, thd->func);

        thread_dbg(MPP_THREAD_DBG_FUNCTION, "thread %s %p context %p create success\n",
                   thd->name, thd->func, thd->ctx.ctx);
        ret = MPP_OK;
    } else {
        thd->status = MPP_STHD_READY;
    }

    pthread_attr_destroy(&attr);

    return ret;
}